

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UCollationResult __thiscall
icu_63::RuleBasedCollator::internalCompareUTF8
          (RuleBasedCollator *this,char *left,int32_t leftLength,char *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  UBool UVar1;
  size_t sVar2;
  UErrorCode *errorCode_local;
  int32_t rightLength_local;
  char *right_local;
  int32_t leftLength_local;
  char *left_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (((left == (char *)0x0) && (leftLength != 0)) ||
       ((right == (char *)0x0 && (rightLength != 0)))) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = UCOL_EQUAL;
    }
    else {
      errorCode_local._4_4_ = rightLength;
      right_local._4_4_ = leftLength;
      if (leftLength < 0) {
        if (-1 < rightLength) {
          sVar2 = strlen(left);
          right_local._4_4_ = (int32_t)sVar2;
        }
      }
      else if (rightLength < 0) {
        sVar2 = strlen(right);
        errorCode_local._4_4_ = (int32_t)sVar2;
      }
      this_local._4_4_ =
           doCompare(this,(uint8_t *)left,right_local._4_4_,(uint8_t *)right,errorCode_local._4_4_,
                     errorCode);
    }
  }
  else {
    this_local._4_4_ = UCOL_EQUAL;
  }
  return this_local._4_4_;
}

Assistant:

UCollationResult
RuleBasedCollator::internalCompareUTF8(const char *left, int32_t leftLength,
                                       const char *right, int32_t rightLength,
                                       UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_EQUAL; }
    if((left == NULL && leftLength != 0) || (right == NULL && rightLength != 0)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_EQUAL;
    }
    // Make sure both or neither strings have a known length.
    // We do not optimize for mixed length/termination.
    if(leftLength >= 0) {
        if(rightLength < 0) { rightLength = static_cast<int32_t>(uprv_strlen(right)); }
    } else {
        if(rightLength >= 0) { leftLength = static_cast<int32_t>(uprv_strlen(left)); }
    }
    return doCompare(reinterpret_cast<const uint8_t *>(left), leftLength,
                     reinterpret_cast<const uint8_t *>(right), rightLength, errorCode);
}